

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_column_mapper.cpp
# Opt level: O2

ResultColumnMapping * __thiscall
duckdb::MultiFileColumnMapper::CreateColumnMapping
          (ResultColumnMapping *__return_storage_ptr__,MultiFileColumnMapper *this)

{
  MultiFileColumnMappingMode MVar1;
  type pBVar2;
  InternalException *this_00;
  allocator local_69;
  NameMapper name_map;
  
  pBVar2 = shared_ptr<duckdb::BaseFileReader,_true>::operator*(&this->reader_data->reader);
  MVar1 = this->bind_data->mapping;
  if (MVar1 == BY_FIELD_ID) {
    FieldIdMapper::FieldIdMapper((FieldIdMapper *)&name_map,&pBVar2->columns);
    CreateColumnMappingByMapper(__return_storage_ptr__,this,&name_map.super_ColumnMapper);
    FieldIdMapper::~FieldIdMapper((FieldIdMapper *)&name_map);
  }
  else {
    if (MVar1 != BY_NAME) {
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&name_map,"Unsupported MultiFileColumnMappingMode type",&local_69);
      InternalException::InternalException(this_00,(string *)&name_map);
      __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    NameMapper::NameMapper(&name_map,this,&pBVar2->columns);
    CreateColumnMappingByMapper(__return_storage_ptr__,this,&name_map.super_ColumnMapper);
    NameMapper::~NameMapper(&name_map);
  }
  return __return_storage_ptr__;
}

Assistant:

ResultColumnMapping MultiFileColumnMapper::CreateColumnMapping() {
	auto &reader = *reader_data.reader;
	auto &local_columns = reader.GetColumns();
	switch (bind_data.mapping) {
	case MultiFileColumnMappingMode::BY_NAME: {
		// we have expected types: create a map of name -> (local) column id
		NameMapper name_map(*this, local_columns);
		return CreateColumnMappingByMapper(name_map);
	}
	case MultiFileColumnMappingMode::BY_FIELD_ID: {
#ifdef DEBUG
		//! Make sure the global columns have field_ids to match on
		for (auto &column : global_columns) {
			D_ASSERT(!column.identifier.IsNull());
			D_ASSERT(column.identifier.type().id() == LogicalTypeId::INTEGER);
		}
#endif

		// we have expected types: create a map of field_id -> column index
		FieldIdMapper field_id_map(local_columns);
		return CreateColumnMappingByMapper(field_id_map);
	}
	default: {
		throw InternalException("Unsupported MultiFileColumnMappingMode type");
	}
	}
}